

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::CompositeInherits(Layer *in_layer,Layer *composited_layer,string *warn,string *err)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  *this;
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  __node_base _Var4;
  bool bVar5;
  __alloc_node_gen_t __alloc_node_gen;
  Layer dst;
  long *local_17c0;
  long local_17b0 [2];
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>_>_>
  local_17a0 [14];
  ios_base local_1730 [264];
  undefined1 local_1628 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1608;
  LayerMetas local_15d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  _Stack_a8;
  undefined8 local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_50;
  void *local_38;
  
  if (composited_layer == (Layer *)0x0) {
    bVar5 = false;
  }
  else {
    local_1628._0_8_ = local_1628 + 0x10;
    pcVar1 = (in_layer->_name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1628,pcVar1,pcVar1 + (in_layer->_name)._M_string_length);
    local_17a0[0]._M_h = (__hashtable_alloc *)(local_1628 + 0x20);
    local_1608._M_buckets = (__buckets_ptr)0x0;
    local_1608._M_bucket_count = (in_layer->_prim_specs)._M_h._M_bucket_count;
    local_1608._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1608._M_element_count = (in_layer->_prim_specs)._M_h._M_element_count;
    local_1608._M_rehash_policy._M_max_load_factor =
         (in_layer->_prim_specs)._M_h._M_rehash_policy._M_max_load_factor;
    local_1608._M_rehash_policy._4_4_ =
         *(undefined4 *)&(in_layer->_prim_specs)._M_h._M_rehash_policy.field_0x4;
    local_1608._M_rehash_policy._M_next_resize =
         (in_layer->_prim_specs)._M_h._M_rehash_policy._M_next_resize;
    local_1608._M_single_bucket = (__node_base_ptr)0x0;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_17a0[0]._M_h,&(in_layer->_prim_specs)._M_h,local_17a0);
    LayerMetas::LayerMetas((LayerMetas *)(local_1628 + 0x58),&in_layer->_metas);
    this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
            *)(local_1628 + 0x1580);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
    ::_Rb_tree(this,&(in_layer->_primspec_path_cache)._M_t);
    local_78._0_1_ = in_layer->_dirty;
    local_78._1_1_ = in_layer->_has_unresolved_references;
    local_78._2_1_ = in_layer->_has_unresolved_payload;
    local_78._3_1_ = in_layer->_has_unresolved_variant;
    local_78._4_1_ = in_layer->_has_unresolved_inherits;
    local_78._5_1_ = in_layer->_has_unresolved_specializes;
    local_78._6_1_ = in_layer->_has_over_primspec;
    local_78._7_1_ = in_layer->_has_class_primspec;
    local_70._M_p = (pointer)&local_60;
    pcVar1 = (in_layer->_current_working_path)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,
               pcVar1 + (in_layer->_current_working_path)._M_string_length);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&vStack_50,&in_layer->_asset_search_paths);
    local_38 = in_layer->_asset_resolution_userdata;
    bVar5 = local_1608._M_before_begin._M_nxt == (_Hash_node_base *)0x0;
    if (!bVar5) {
      _Var4._M_nxt = local_1608._M_before_begin._M_nxt;
      do {
        bVar2 = anon_unknown_160::CompositeInheritsRec
                          (0,(Layer *)local_1628,(PrimSpec *)(_Var4._M_nxt + 5),warn,err);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_17a0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_17a0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_17a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_17a0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_17a0,"CompositeInherits",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_17a0,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_17a0,0x44d);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_17a0,"Composite `inherits` failed.",0x1c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_17a0,"\n",1);
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,(ulong)local_17c0);
            if (local_17c0 != local_17b0) {
              operator_delete(local_17c0,local_17b0[0] + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_17a0);
          ::std::ios_base::~ios_base(local_1730);
          if (!bVar2) goto LAB_001ae66c;
        }
        _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
        bVar5 = _Var4._M_nxt == (_Hash_node_base *)0x0;
      } while (!bVar5);
    }
    ::std::__cxx11::string::_M_assign((string *)composited_layer);
    if ((Layer *)local_1628 != composited_layer) {
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&composited_layer->_prim_specs,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_1628 + 0x20));
    }
    LayerMetas::operator=(&composited_layer->_metas,(LayerMetas *)(local_1628 + 0x58));
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
    ::operator=(&(composited_layer->_primspec_path_cache)._M_t,this);
    composited_layer->_dirty = local_78._0_1_;
    composited_layer->_has_unresolved_references = local_78._1_1_;
    composited_layer->_has_unresolved_payload = local_78._2_1_;
    composited_layer->_has_unresolved_variant = local_78._3_1_;
    composited_layer->_has_unresolved_inherits = local_78._4_1_;
    composited_layer->_has_unresolved_specializes = local_78._5_1_;
    composited_layer->_has_over_primspec = local_78._6_1_;
    composited_layer->_has_class_primspec = local_78._7_1_;
    ::std::__cxx11::string::_M_assign((string *)&composited_layer->_current_working_path);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&composited_layer->_asset_search_paths,&vStack_50);
    composited_layer->_asset_resolution_userdata = local_38;
LAB_001ae66c:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
    ::_M_erase(this,(_Link_type)_Stack_a8._M_impl.super__Rb_tree_header._M_header._M_parent);
    LayerMetas::~LayerMetas((LayerMetas *)(local_1628 + 0x58));
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_1628 + 0x20));
    if ((undefined1 *)local_1628._0_8_ != local_1628 + 0x10) {
      operator_delete((void *)local_1628._0_8_,local_1628._16_8_ + 1);
    }
  }
  return bVar5;
}

Assistant:

bool CompositeInherits(const Layer &in_layer, Layer *composited_layer,
                       std::string *warn, std::string *err) {
  if (!composited_layer) {
    return false;
  }

  Layer dst = in_layer;  // deep copy

  for (auto &item : dst.primspecs()) {
    if (!CompositeInheritsRec(/* depth */ 0, dst, item.second, warn, err)) {
      PUSH_ERROR_AND_RETURN("Composite `inherits` failed.");
    }
  }

  (*composited_layer) = dst;

  DCOUT("Composite `inherits` ok.");
  return true;
}